

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O3

Vec_Int_t * Bmc_ChainFindFailedOutputs(Gia_Man_t *p,Vec_Ptr_t *vCexes)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  Vec_Int_t *vSatIds;
  int *piVar5;
  sat_solver *s;
  Vec_Int_t *p_01;
  Vec_Int_t *pVVar6;
  Abc_Cex_t *pAVar7;
  void **ppvVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int Lit;
  int local_4c;
  Vec_Ptr_t *local_48;
  Vec_Int_t *local_40;
  Gia_Man_t *local_38;
  
  local_48 = vCexes;
  p_00 = Gia_ManDupPosAndPropagateInit(p);
  iVar12 = p->vCis->nSize - p->nRegs;
  local_38 = p;
  vSatIds = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar12 - 1U) {
    iVar9 = iVar12;
  }
  vSatIds->nSize = 0;
  vSatIds->nCap = iVar9;
  if (iVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  vSatIds->pArray = piVar5;
  s = Gia_ManDeriveSatSolver(p_00,vSatIds);
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_01->pArray = piVar5;
  pVVar6 = p_00->vCos;
  uVar10 = (ulong)(uint)pVVar6->nSize;
  if (p_00->nRegs < pVVar6->nSize) {
    lVar13 = 0;
    local_40 = p_01;
    do {
      if ((int)uVar10 <= lVar13) {
LAB_005898a6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = pVVar6->pArray[lVar13];
      if (((long)iVar9 < 0) || (p_00->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(p_00->pObjs + iVar9);
      uVar4 = iVar9 - (uVar1 & 0x1fffffff);
      if ((int)uVar4 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if ((uVar4 & 0x7fffffff) != 0 || (uVar1 >> 0x1d & 1) != 0) {
        iVar9 = (int)lVar13;
        local_4c = iVar9 * 2 + 2;
        iVar12 = sat_solver_solve(s,&local_4c,(lit *)&local_48,0,0,0,0);
        if ((iVar12 == 1) &&
           (Vec_IntPush(p_01,iVar9), pGVar3 = local_38, local_48 != (Vec_Ptr_t *)0x0)) {
          pAVar7 = Abc_CexAlloc(local_38->nRegs,local_38->vCis->nSize - local_38->nRegs,1);
          pAVar7->iFrame = 0;
          pAVar7->iPo = iVar9;
          pVVar6 = pGVar3->vCis;
          iVar9 = pGVar3->nRegs;
          iVar12 = pVVar6->nSize;
          if (iVar9 < iVar12) {
            lVar11 = 0;
            do {
              if (vSatIds->nSize <= lVar11) goto LAB_005898a6;
              iVar2 = vSatIds->pArray[lVar11];
              if (((long)iVar2 < 0) || (s->size <= iVar2)) {
                __assert_fail("v >= 0 && v < s->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                              ,0xda,"int sat_solver_var_value(sat_solver *, int)");
              }
              if (s->model[iVar2] == 1) {
                iVar9 = iVar9 + (int)lVar11;
                (&pAVar7[1].iPo)[iVar9 >> 5] =
                     (&pAVar7[1].iPo)[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
                iVar9 = local_38->nRegs;
                iVar12 = pVVar6->nSize;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < iVar12 - iVar9);
          }
          uVar1 = local_48->nSize;
          if (uVar1 == local_48->nCap) {
            if ((int)uVar1 < 0x10) {
              if (local_48->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(local_48->pArray,0x80);
              }
              local_48->pArray = ppvVar8;
              local_48->nCap = 0x10;
            }
            else {
              if (local_48->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(local_48->pArray,(ulong)uVar1 << 4);
              }
              local_48->pArray = ppvVar8;
              local_48->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar8 = local_48->pArray;
          }
          iVar9 = local_48->nSize;
          local_48->nSize = iVar9 + 1;
          ppvVar8[iVar9] = pAVar7;
          p_01 = local_40;
        }
      }
      lVar13 = lVar13 + 1;
      pVVar6 = p_00->vCos;
      uVar10 = (ulong)pVVar6->nSize;
    } while (lVar13 < (long)(uVar10 - (long)p_00->nRegs));
  }
  Gia_ManStop(p_00);
  sat_solver_delete(s);
  if (vSatIds->pArray != (int *)0x0) {
    free(vSatIds->pArray);
  }
  free(vSatIds);
  return p_01;
}

Assistant:

Vec_Int_t * Bmc_ChainFindFailedOutputs( Gia_Man_t * p, Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vOutputs;
    Vec_Int_t * vSatIds;
    Gia_Man_t * pInit;
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, j, Lit, status = 0;
    // derive output logic cones
    pInit = Gia_ManDupPosAndPropagateInit( p );
    // derive SAT solver and test
    vSatIds = Vec_IntAlloc( Gia_ManPiNum(p) );
    pSat = Gia_ManDeriveSatSolver( pInit, vSatIds );
    vOutputs = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pInit, pObj, i )
    {
        if ( Gia_ObjFaninLit0p(pInit, pObj) == 0 )
            continue;
        Lit = Abc_Var2Lit( i+1, 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
        if ( status == l_True )
        {
            // save the index of solved output
            Vec_IntPush( vOutputs, i );
            // create CEX for this output
            if ( vCexes )
            {
                Abc_Cex_t * pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = i;
                for ( j = 0; j < Gia_ManPiNum(p); j++ )
                    if ( sat_solver_var_value( pSat, Vec_IntEntry(vSatIds, j) ) )
                        Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + j );
                Vec_PtrPush( vCexes, pCex );
            }
        }
    }
    Gia_ManStop( pInit );
    sat_solver_delete( pSat );
    Vec_IntFree( vSatIds );
    return vOutputs;
}